

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O1

void CGL::SVGParser::parseTexture(XMLElement *xml)

{
  uint uVar1;
  char *pcVar2;
  long *plVar3;
  size_t sVar4;
  Texture *this;
  mapped_type *ppTVar5;
  long *plVar6;
  uint uVar7;
  int k;
  int iVar8;
  uint width;
  uint height;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels_no_alpha;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string texid;
  uint local_b0;
  uint local_ac;
  string local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ulong local_68;
  long *local_60 [2];
  long local_50 [2];
  key_type local_40;
  
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"texid",(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,pcVar2,(allocator<char> *)&local_a8);
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"filename",(char *)0x0);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,pcVar2,(allocator<char> *)&local_68);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,dir_abi_cxx11_);
  plVar6 = plVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar6) {
    local_a8.field_2._M_allocated_capacity = *plVar6;
    local_a8.field_2._8_8_ = plVar3[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *plVar6;
    local_a8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_a8._M_string_length = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar1 = lodepng::decode(&local_88,&local_b0,&local_ac,&local_a8,LCT_RGBA,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (uVar1 == 0) {
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    uVar1 = local_ac;
    if (local_ac != 0) {
      uVar7 = 0;
      do {
        if (local_b0 != 0) {
          uVar1 = 0;
          do {
            iVar8 = 0;
            do {
              if (local_a8._M_string_length == local_a8.field_2._M_allocated_capacity) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                           (iterator)local_a8._M_string_length,
                           local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                           (iVar8 + (local_b0 * uVar7 + uVar1) * 4));
              }
              else {
                *(uchar *)local_a8._M_string_length =
                     local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [iVar8 + (local_b0 * uVar7 + uVar1) * 4];
                local_a8._M_string_length = local_a8._M_string_length + 1;
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 != 3);
            uVar1 = uVar1 + 1;
          } while (uVar1 < local_b0);
        }
        uVar7 = uVar7 + 1;
        uVar1 = local_ac;
      } while (uVar7 < local_ac);
    }
    this = (Texture *)operator_new(0x28);
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this->width = 0;
    this->height = 0;
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60[0] = (long *)(ulong)local_b0;
    local_68 = (ulong)uVar1;
    Texture::init(this,(EVP_PKEY_CTX *)&local_a8);
    ppTVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*>_>_>
                            *)(curr_svg + 0x20),&local_40);
    *ppTVar5 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_a8._M_dataplus._M_p,
                      local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," could not load image ",0x16);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2299b8);
    }
    else {
      sVar4 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SVGParser::parseTexture( XMLElement* xml ) {
  string texid = xml->Attribute("texid");

  const char* file = xml->Attribute( "filename" );
  vector<unsigned char> pixels;
  unsigned int width, height;
  int err = lodepng::decode(pixels, width, height, dir + string(file));
  if (err) {
    cerr << " could not load image " << file << endl;
    return;
  }

  // Strip the alpha channel
  vector<unsigned char> pixels_no_alpha;
  for (int y = 0; y < height; ++y) {
    for (int x = 0; x < width; ++x) {
      for (int k = 0; k < 3; ++k) {
        pixels_no_alpha.push_back(pixels[4 * (y * width + x) + k]);
      }
    }
  }

  Texture *tex = new Texture();
  tex->init(pixels_no_alpha, width, height);
  curr_svg->textures[texid] = tex;

}